

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_netstd_union_reader
          (t_netstd_generator *this,ostream *out,t_struct *tunion)

{
  t_field *tfield;
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference pptVar5;
  t_type *ptVar6;
  string *psVar7;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  allocator local_299;
  string local_298;
  undefined1 local_278 [8];
  string tmpvar;
  string local_238;
  string local_218;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_1f8
  ;
  t_field **local_1f0;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  allocator local_e1;
  string local_e0;
  undefined1 local_c0 [8];
  string tmpRetval;
  string local_80;
  string local_50;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_30;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *tunion_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  f_iter._M_current = (t_field **)t_struct::get_members(tunion);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_30);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_50);
  poVar4 = std::operator<<(poVar4,"public static async Task<");
  iVar2 = (*(tunion->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar2));
  poVar4 = std::operator<<(poVar4,"> ReadAsync(TProtocol iprot, CancellationToken ");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,")");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&local_80,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_80);
  poVar4 = std::operator<<(poVar4,"iprot.IncrementRecursionDepth();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_80);
  t_generator::indent_abi_cxx11_((string *)(tmpRetval.field_2._M_local_buf + 8),(t_generator *)this)
  ;
  poVar4 = std::operator<<(out,(string *)(tmpRetval.field_2._M_local_buf + 8));
  poVar4 = std::operator<<(poVar4,"try");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(tmpRetval.field_2._M_local_buf + 8));
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"tmp",&local_e1);
  t_generator::tmp((string *)local_c0,(t_generator *)this,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  t_generator::indent_abi_cxx11_(&local_108,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_108);
  iVar2 = (*(tunion->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_00,iVar2));
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,(string *)local_c0);
  poVar4 = std::operator<<(poVar4,";");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_108);
  t_generator::indent_abi_cxx11_(&local_128,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_128);
  poVar4 = std::operator<<(poVar4,"await iprot.ReadStructBeginAsync(");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_128);
  t_generator::indent_abi_cxx11_(&local_148,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_148);
  poVar4 = std::operator<<(poVar4,"TField field = await iprot.ReadFieldBeginAsync(");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_148);
  t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_168);
  poVar4 = std::operator<<(poVar4,"if (field.Type == TType.Stop)");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_168);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_188);
  poVar4 = std::operator<<(poVar4,"await iprot.ReadFieldEndAsync(");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_188);
  t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_1a8);
  poVar4 = std::operator<<(poVar4,"");
  poVar4 = std::operator<<(poVar4,(string *)local_c0);
  poVar4 = std::operator<<(poVar4," = new ___undefined();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1a8);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&local_1c8,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_1c8);
  poVar4 = std::operator<<(poVar4,"else");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1c8);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&local_1e8,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_1e8);
  poVar4 = std::operator<<(poVar4,"switch (field.ID)");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1e8);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  local_1f0 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_30._M_current = local_1f0;
  while( true ) {
    local_1f8._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_1f8);
    if (!bVar1) break;
    t_generator::indent_abi_cxx11_(&local_218,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_218);
    poVar4 = std::operator<<(poVar4,"case ");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    iVar3 = t_field::get_key(*pptVar5);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,":");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_218);
    t_generator::indent_up((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_238,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_238);
    poVar4 = std::operator<<(poVar4,"if (field.Type == ");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    ptVar6 = t_field::get_type(*pptVar5);
    type_to_enum_abi_cxx11_((string *)((long)&tmpvar.field_2 + 8),this,ptVar6);
    poVar4 = std::operator<<(poVar4,(string *)(tmpvar.field_2._M_local_buf + 8));
    poVar4 = std::operator<<(poVar4,") {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)(tmpvar.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_238);
    t_generator::indent_up((t_generator *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_298,"tmp",&local_299);
    t_generator::tmp((string *)local_278,(t_generator *)this,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator((allocator<char> *)&local_299);
    t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_2c0);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    ptVar6 = t_field::get_type(*pptVar5);
    type_name_abi_cxx11_(&local_2e0,this,ptVar6,true);
    poVar4 = std::operator<<(poVar4,(string *)&local_2e0);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,(string *)local_278);
    poVar4 = std::operator<<(poVar4,";");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c0);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    tfield = *pptVar5;
    std::__cxx11::string::string((string *)&local_300,(string *)local_278);
    generate_deserialize_field(this,out,tfield,&local_300,true);
    std::__cxx11::string::~string((string *)&local_300);
    t_generator::indent_abi_cxx11_(&local_320,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_320);
    poVar4 = std::operator<<(poVar4,(string *)local_c0);
    poVar4 = std::operator<<(poVar4," = new ");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    psVar7 = t_field::get_name_abi_cxx11_(*pptVar5);
    poVar4 = std::operator<<(poVar4,(string *)psVar7);
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = std::operator<<(poVar4,(string *)local_278);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_320);
    t_generator::indent_down((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_340,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_340);
    poVar4 = std::operator<<(poVar4,"} else { ");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_360,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_360);
    poVar4 = std::operator<<(poVar4," await TProtocolUtil.SkipAsync(iprot, field.Type, ");
    poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,");");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_380,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_380);
    poVar4 = std::operator<<(poVar4,"  ");
    poVar4 = std::operator<<(poVar4,(string *)local_c0);
    poVar4 = std::operator<<(poVar4," = new ___undefined();");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_3a0,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_3a0);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_3c0,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_3c0);
    poVar4 = std::operator<<(poVar4,"break;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
    t_generator::indent_down((t_generator *)this);
    std::__cxx11::string::~string((string *)local_278);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_30);
  }
  t_generator::indent_abi_cxx11_(&local_3e0,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_3e0);
  poVar4 = std::operator<<(poVar4,"default: ");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3e0);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_400,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_400);
  poVar4 = std::operator<<(poVar4,"await TProtocolUtil.SkipAsync(iprot, field.Type, ");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_420,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_420);
  poVar4 = std::operator<<(poVar4,(string *)local_c0);
  poVar4 = std::operator<<(poVar4," = new ___undefined();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_400);
  t_generator::indent_abi_cxx11_(&local_440,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_440);
  poVar4 = std::operator<<(poVar4,"break;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_440);
  t_generator::indent_down((t_generator *)this);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&local_460,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_460);
  poVar4 = std::operator<<(poVar4,"await iprot.ReadFieldEndAsync(");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_460);
  t_generator::indent_abi_cxx11_(&local_480,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_480);
  poVar4 = std::operator<<(poVar4,"if ((await iprot.ReadFieldBeginAsync(");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,")).Type != TType.Stop)");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_480);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&local_4a0,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_4a0);
  poVar4 = std::operator<<(poVar4,"throw new TProtocolException(TProtocolException.INVALID_DATA);");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_4a0);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&local_4c0,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_4c0);
  poVar4 = std::operator<<(poVar4,"await iprot.ReadStructEndAsync(");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_4c0);
  t_generator::indent_abi_cxx11_(&local_4e0,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_4e0);
  poVar4 = std::operator<<(poVar4,"return ");
  poVar4 = std::operator<<(poVar4,(string *)local_c0);
  poVar4 = std::operator<<(poVar4,";");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_4e0);
  t_generator::indent_down((t_generator *)this);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&local_500,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_500);
  poVar4 = std::operator<<(poVar4,"finally");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_500);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&local_520,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_520);
  poVar4 = std::operator<<(poVar4,"iprot.DecrementRecursionDepth();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_520);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&local_540,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_540);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_540);
  std::__cxx11::string::~string((string *)local_c0);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_union_reader(ostream& out, t_struct* tunion)
{
    // Thanks to THRIFT-1768, we don't need to check for required fields in the union
    const vector<t_field*>& fields = tunion->get_members();
    vector<t_field*>::const_iterator f_iter;

    out << indent() << "public static async Task<" << tunion->get_name() << "> ReadAsync(TProtocol iprot, CancellationToken " << CANCELLATION_TOKEN_NAME << ")" << endl;
    scope_up(out);

    out << indent() << "iprot.IncrementRecursionDepth();" << endl;
    out << indent() << "try" << endl;
    scope_up(out);

    string tmpRetval = tmp("tmp");
    out << indent() << tunion->get_name() << " " << tmpRetval << ";" << endl;
    out << indent() << "await iprot.ReadStructBeginAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    out << indent() << "TField field = await iprot.ReadFieldBeginAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    // we cannot have the first field be a stop -- we must have a single field defined
    out << indent() << "if (field.Type == TType.Stop)" << endl;
    scope_up(out);
    out << indent() << "await iprot.ReadFieldEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    out << indent() << "" << tmpRetval << " = new ___undefined();" << endl;
    scope_down(out);
    out << indent() << "else" << endl;
    scope_up(out);
    out << indent() << "switch (field.ID)" << endl;
    scope_up(out);

    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        out << indent() << "case " << (*f_iter)->get_key() << ":" << endl;
        indent_up();
        out << indent() << "if (field.Type == " << type_to_enum((*f_iter)->get_type()) << ") {" << endl;
        indent_up();

        string tmpvar = tmp("tmp");
        out << indent() << type_name((*f_iter)->get_type()) << " " << tmpvar << ";" << endl;
        generate_deserialize_field(out, (*f_iter), tmpvar, true);
        out << indent() << tmpRetval << " = new " << (*f_iter)->get_name() << "(" << tmpvar << ");" << endl;

        indent_down();
        out << indent() << "} else { " << endl << indent() << " await TProtocolUtil.SkipAsync(iprot, field.Type, " << CANCELLATION_TOKEN_NAME << ");"
            << endl << indent() << "  " << tmpRetval << " = new ___undefined();" << endl << indent() << "}" << endl
            << indent() << "break;" << endl;
        indent_down();
    }

    out << indent() << "default: " << endl;
    indent_up();
    out << indent() << "await TProtocolUtil.SkipAsync(iprot, field.Type, " << CANCELLATION_TOKEN_NAME << ");" << endl << indent()
        << tmpRetval << " = new ___undefined();" << endl;
    out << indent() << "break;" << endl;
    indent_down();

    scope_down(out);

    out << indent() << "await iprot.ReadFieldEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;

    out << indent() << "if ((await iprot.ReadFieldBeginAsync(" << CANCELLATION_TOKEN_NAME << ")).Type != TType.Stop)" << endl;
    scope_up(out);
    out << indent() << "throw new TProtocolException(TProtocolException.INVALID_DATA);" << endl;
    scope_down(out);

    // end of else for TStop
    scope_down(out);
    out << indent() << "await iprot.ReadStructEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    out << indent() << "return " << tmpRetval << ";" << endl;
    indent_down();

    scope_down(out);
    out << indent() << "finally" << endl;
    scope_up(out);
    out << indent() << "iprot.DecrementRecursionDepth();" << endl;
    scope_down(out);

    out << indent() << "}" << endl << endl;
}